

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes Bcj2Dec_Decode(CBcj2Dec *p)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint *puVar4;
  int *piVar5;
  Byte *pBVar6;
  uint uVar7;
  UInt32 UVar8;
  byte *pbVar9;
  ulong uVar10;
  byte bVar11;
  byte *pbVar12;
  UInt32 _vvv_;
  int iVar13;
  byte *pbVar14;
  long lVar15;
  ulong uVar16;
  
  uVar7 = p->range;
  if (5 < uVar7) {
    uVar7 = p->state;
    if ((uVar7 & 0xfffffffc) == 4) {
      pBVar6 = p->dest;
      do {
        if (pBVar6 == p->destLim) {
          return 0;
        }
        p->state = uVar7 + 1;
        *pBVar6 = p->temp[uVar7 - 4];
        pBVar6 = pBVar6 + 1;
        p->dest = pBVar6;
        uVar7 = p->state;
      } while (uVar7 < 8);
    }
LAB_0011148d:
    do {
      if (uVar7 - 1 < 2) {
        p->state = 9;
        bVar11 = p->temp[3];
LAB_001115ed:
        uVar7 = (bVar11 != 0xe8) + 1;
        puVar4 = (uint *)p->bufs[uVar7];
        if (puVar4 == (uint *)p->lims[uVar7]) goto LAB_001116b1;
        uVar3 = *puVar4;
        p->bufs[uVar7] = (Byte *)(puVar4 + 1);
        UVar8 = p->ip + 4;
        p->ip = UVar8;
        iVar13 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) -
                 UVar8;
        piVar5 = (int *)p->dest;
        uVar10 = (long)p->destLim - (long)piVar5;
        if (uVar10 < 4) {
          *(int *)p->temp = iVar13;
          if ((int *)p->destLim != piVar5) {
            lVar15 = 0;
            do {
              *(Byte *)((long)piVar5 + lVar15) = p->temp[lVar15];
              lVar15 = lVar15 + 1;
            } while (uVar10 + (uVar10 == 0) != lVar15);
          }
          p->dest = (Byte *)((long)piVar5 + uVar10);
          uVar7 = (uint)uVar10 | 4;
LAB_001116b1:
          p->state = uVar7;
          if ((p->range < 0x1000000) && (pbVar9 = p->bufs[3], pbVar9 != p->lims[3])) {
            p->range = p->range << 8;
            UVar8 = p->code;
            p->bufs[3] = pbVar9 + 1;
            p->code = (uint)*pbVar9 | UVar8 << 8;
          }
          return 0;
        }
        *piVar5 = iVar13;
        p->temp[3] = (Byte)((uint)iVar13 >> 0x18);
        p->dest = (Byte *)(piVar5 + 1);
      }
      else {
        if (p->range < 0x1000000) {
          pbVar9 = p->bufs[3];
          if (pbVar9 == p->lims[3]) goto LAB_0011164a;
          p->range = p->range << 8;
          UVar8 = p->code;
          p->bufs[3] = pbVar9 + 1;
          p->code = (uint)*pbVar9 | UVar8 << 8;
        }
        pbVar9 = p->bufs[0];
        uVar10 = (long)p->lims[0] - (long)pbVar9;
        if (uVar10 == 0) {
          p->state = 0;
          return 0;
        }
        pbVar14 = p->dest;
        uVar16 = (long)p->destLim - (long)pbVar14;
        if ((uVar16 < uVar10) && (uVar10 = uVar16, uVar16 == 0)) {
          p->state = 8;
          return 0;
        }
        pbVar12 = pbVar9 + uVar10;
        do {
          while( true ) {
            bVar11 = *pbVar9;
            *pbVar14 = bVar11;
            if (bVar11 != 0xf) break;
            pbVar9 = pbVar9 + 1;
            if (pbVar9 == pbVar12) {
              lVar15 = (long)pbVar12 - (long)p->bufs[0];
              goto LAB_00111659;
            }
            pbVar14 = pbVar14 + 1;
          }
          if ((bVar11 & 0xfe) == 0xe8) break;
          pbVar14 = pbVar14 + 1;
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar12);
        lVar15 = (long)pbVar9 - (long)p->bufs[0];
        if (pbVar9 == pbVar12) {
LAB_00111659:
          pbVar9 = p->lims[0];
          p->temp[3] = pbVar12[-1];
          p->bufs[0] = pbVar12;
          p->ip = p->ip + (int)lVar15;
          p->dest = p->dest + lVar15;
          p->state = (uint)(pbVar12 != pbVar9) << 3;
          return 0;
        }
        bVar11 = *pbVar9;
        pBVar6 = pbVar9 + -1;
        if (pbVar9 == p->bufs[0]) {
          pBVar6 = p->temp + 3;
        }
        bVar1 = *pBVar6;
        p->temp[3] = bVar11;
        p->bufs[0] = pbVar9 + 1;
        p->ip = p->ip + (int)(lVar15 + 1);
        p->dest = p->dest + lVar15 + 1;
        uVar10 = (ulong)(bVar11 == 0xe9);
        if (bVar11 == 0xe8) {
          uVar10 = (ulong)bVar1 + 2;
        }
        uVar2 = p->probs[uVar10];
        uVar7 = (p->range >> 0xb) * (uint)uVar2;
        if (uVar7 <= p->code) {
          p->range = p->range - uVar7;
          p->code = p->code - uVar7;
          p->probs[uVar10] = uVar2 - (uVar2 >> 5);
          goto LAB_001115ed;
        }
        p->range = uVar7;
        p->probs[uVar10] = (short)(0x800 - uVar2 >> 5) + uVar2;
      }
      uVar7 = p->state;
    } while( true );
  }
  p->state = 9;
  while( true ) {
    if (uVar7 == 1) {
      if (p->code != 0) {
        return 1;
      }
    }
    else if (uVar7 == 5) {
      if (p->code == 0xffffffff) {
        return 1;
      }
      p->range = 0xffffffff;
      uVar7 = 9;
      goto LAB_0011148d;
    }
    pbVar9 = p->bufs[3];
    if (pbVar9 == p->lims[3]) break;
    UVar8 = p->code;
    p->bufs[3] = pbVar9 + 1;
    p->code = (uint)*pbVar9 | UVar8 << 8;
    uVar7 = uVar7 + 1;
    p->range = uVar7;
  }
LAB_0011164a:
  p->state = 3;
  return 0;
}

Assistant:

static SRes Bcj2Dec_Decode(CBcj2Dec *p)
{
  if (p->range <= 5)
  {
    p->state = BCJ2_DEC_STATE_OK;
    for (; p->range != 5; p->range++)
    {
      if (p->range == 1 && p->code != 0)
        return SZ_ERROR_DATA;
      
      if (p->bufs[BCJ2_STREAM_RC] == p->lims[BCJ2_STREAM_RC])
      {
        p->state = BCJ2_STREAM_RC;
        return SZ_OK;
      }

      p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
    }
    
    if (p->code == 0xFFFFFFFF)
      return SZ_ERROR_DATA;
    
    p->range = 0xFFFFFFFF;
  }
  else if (p->state >= BCJ2_DEC_STATE_ORIG_0)
  {
    while (p->state <= BCJ2_DEC_STATE_ORIG_3)
    {
      Byte *dest = p->dest;
      if (dest == p->destLim)
        return SZ_OK;
      *dest = p->temp[p->state++ - BCJ2_DEC_STATE_ORIG_0];
      p->dest = dest + 1;
    }
  }

  /*
  if (BCJ2_IS_32BIT_STREAM(p->state))
  {
    const Byte *cur = p->bufs[p->state];
    if (cur == p->lims[p->state])
      return SZ_OK;
    p->bufs[p->state] = cur + 4;
    
    {
      UInt32 val;
      Byte *dest;
      SizeT rem;
      
      p->ip += 4;
      val = GetBe32(cur) - p->ip;
      dest = p->dest;
      rem = p->destLim - dest;
      if (rem < 4)
      {
        SizeT i;
        SetUi32(p->temp, val);
        for (i = 0; i < rem; i++)
          dest[i] = p->temp[i];
        p->dest = dest + rem;
        p->state = BCJ2_DEC_STATE_ORIG_0 + (unsigned)rem;
        return SZ_OK;
      }
      SetUi32(dest, val);
      p->temp[3] = (Byte)(val >> 24);
      p->dest = dest + 4;
      p->state = BCJ2_DEC_STATE_OK;
    }
  }
  */

  for (;;)
  {
    if (BCJ2_IS_32BIT_STREAM(p->state))
      p->state = BCJ2_DEC_STATE_OK;
    else
    {
      if (p->range < kTopValue)
      {
        if (p->bufs[BCJ2_STREAM_RC] == p->lims[BCJ2_STREAM_RC])
        {
          p->state = BCJ2_STREAM_RC;
          return SZ_OK;
        }
        p->range <<= 8;
        p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
      }

      {
        const Byte *src = p->bufs[BCJ2_STREAM_MAIN];
        const Byte *srcLim;
        Byte *dest;
        SizeT num = p->lims[BCJ2_STREAM_MAIN] - src;
        
        if (num == 0)
        {
          p->state = BCJ2_STREAM_MAIN;
          return SZ_OK;
        }
        
        dest = p->dest;
        if (num > (SizeT)(p->destLim - dest))
        {
          num = p->destLim - dest;
          if (num == 0)
          {
            p->state = BCJ2_DEC_STATE_ORIG;
            return SZ_OK;
          }
        }
       
        srcLim = src + num;

        if (p->temp[3] == 0x0F && (src[0] & 0xF0) == 0x80)
          *dest = src[0];
        else for (;;)
        {
          Byte b = *src;
          *dest = b;
          if (b != 0x0F)
          {
            if ((b & 0xFE) == 0xE8)
              break;
            dest++;
            if (++src != srcLim)
              continue;
            break;
          }
          dest++;
          if (++src == srcLim)
            break;
          if ((*src & 0xF0) != 0x80)
            continue;
          *dest = *src;
          break;
        }
        
        num = src - p->bufs[BCJ2_STREAM_MAIN];
        
        if (src == srcLim)
        {
          p->temp[3] = src[-1];
          p->bufs[BCJ2_STREAM_MAIN] = src;
          p->ip += (UInt32)num;
          p->dest += num;
          p->state =
            p->bufs[BCJ2_STREAM_MAIN] ==
            p->lims[BCJ2_STREAM_MAIN] ?
              (unsigned)BCJ2_STREAM_MAIN :
              (unsigned)BCJ2_DEC_STATE_ORIG;
          return SZ_OK;
        }
        
        {
          UInt32 bound, ttt;
          CProb *prob;
          Byte b = src[0];
          Byte prev = (Byte)(num == 0 ? p->temp[3] : src[-1]);
          
          p->temp[3] = b;
          p->bufs[BCJ2_STREAM_MAIN] = src + 1;
          num++;
          p->ip += (UInt32)num;
          p->dest += num;
          
          prob = p->probs + (unsigned)(b == 0xE8 ? 2 + (unsigned)prev : (b == 0xE9 ? 1 : 0));
          
          _IF_BIT_0
          {
            _UPDATE_0
            continue;
          }
          _UPDATE_1
            
        }
      }
    }

    {
      UInt32 val;
      unsigned cj = (p->temp[3] == 0xE8) ? BCJ2_STREAM_CALL : BCJ2_STREAM_JUMP;
      const Byte *cur = p->bufs[cj];
      Byte *dest;
      SizeT rem;
      
      if (cur == p->lims[cj])
      {
        p->state = cj;
        break;
      }
      
      val = GetBe32(cur);
      p->bufs[cj] = cur + 4;

      p->ip += 4;
      val -= p->ip;
      dest = p->dest;
      rem = p->destLim - dest;
      
      if (rem < 4)
      {
        SizeT i;
        SetUi32(p->temp, val);
        for (i = 0; i < rem; i++)
          dest[i] = p->temp[i];
        p->dest = dest + rem;
        p->state = BCJ2_DEC_STATE_ORIG_0 + (unsigned)rem;
        break;
      }
      
      SetUi32(dest, val);
      p->temp[3] = (Byte)(val >> 24);
      p->dest = dest + 4;
    }
  }

  if (p->range < kTopValue && p->bufs[BCJ2_STREAM_RC] != p->lims[BCJ2_STREAM_RC])
  {
    p->range <<= 8;
    p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
  }

  return SZ_OK;
}